

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleTypeHandler<3UL>::SimpleTypeHandler
          (SimpleTypeHandler<3UL> *this,long SharedFunctionPropertyDescriptors,byte param_3,
          uint16 param_4,uint16 param_5)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SimplePropertyDescriptor *local_38;
  ulong local_30;
  size_t i;
  uint16 offsetOfInlineSlots_local;
  uint16 inlineSlotCapacity_local;
  PropertyTypes propertyTypes_local;
  SimplePropertyDescriptor (*SharedFunctionPropertyDescriptors_local) [3];
  SimpleTypeHandler<3UL> *this_local;
  
  DynamicTypeHandler::DynamicTypeHandler(&this->super_DynamicTypeHandler,3,param_4,param_5,'\x1d');
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01e4dbf8
  ;
  this->propertyCount = 3;
  local_38 = this->descriptors;
  do {
    SimplePropertyDescriptor::SimplePropertyDescriptor(local_38);
    local_38 = local_38 + 1;
  } while ((SimpleTypeHandler<3UL> *)local_38 != this + 1);
  local_30 = 0;
  do {
    if (2 < local_30) {
      if ((param_3 & 0x60) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0x47,
                                    "((propertyTypes & ((0x80|0x10|0x20|0x40) & ~(0x10 | 0x80))) == 0)"
                                    ,
                                    "(propertyTypes & (PropertyTypesAll & ~(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties))) == 0"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      DynamicTypeHandler::SetPropertyTypes(&this->super_DynamicTypeHandler,0x90,param_3);
      DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
      return;
    }
    if ((*(byte *)(SharedFunctionPropertyDescriptors + local_30 * 0x10 + 8) & 8) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                  ,0x42,
                                  "((SharedFunctionPropertyDescriptors[i].Attributes & 0x08) == 0)",
                                  "(SharedFunctionPropertyDescriptors[i].Attributes & PropertyDeleted) == 0"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    Memory::NoWriteBarrierSet<Js::PropertyRecord_const>
              (&this->descriptors[local_30].Id,
               (WriteBarrierPtr<const_Js::PropertyRecord> *)
               (SharedFunctionPropertyDescriptors + local_30 * 0x10));
    this->descriptors[local_30].field_1.Attributes =
         *(Type *)(SharedFunctionPropertyDescriptors + local_30 * 0x10 + 8);
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

SimpleTypeHandler<size>::SimpleTypeHandler(NO_WRITE_BARRIER_TAG_TYPE(SimplePropertyDescriptor const (&SharedFunctionPropertyDescriptors)[size]), PropertyTypes propertyTypes, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots) :
         DynamicTypeHandler(sizeof(descriptors) / sizeof(SimplePropertyDescriptor),
         inlineSlotCapacity, offsetOfInlineSlots, DefaultFlags | IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag), propertyCount(size)
    {
        for (size_t i = 0; i < size; i++)
        {
            Assert((SharedFunctionPropertyDescriptors[i].Attributes & PropertyDeleted) == 0);
             // Used to init from global static BuiltInPropertyId
            NoWriteBarrierSet(descriptors[i].Id, SharedFunctionPropertyDescriptors[i].Id);
            descriptors[i].Attributes = SharedFunctionPropertyDescriptors[i].Attributes;
        }
        Assert((propertyTypes & (PropertyTypesAll & ~(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties))) == 0);
        SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties, propertyTypes);
        SetIsInlineSlotCapacityLocked();
    }